

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReaderManager.cpp
# Opt level: O3

void __thiscall
BufferedReaderManager::BufferedReaderManager
          (BufferedReaderManager *this,uint32_t readersCnt,uint32_t blockSize,uint32_t allocSize,
          uint32_t prereadThreshold)

{
  pointer *pppBVar1;
  iterator __position;
  uint uVar2;
  BufferedReader *this_00;
  uint32_t uVar3;
  BufferedReader *reader;
  BufferedReader *local_38;
  
  (this->m_fileReaders).super__Vector_base<BufferedReader_*,_std::allocator<BufferedReader_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_fileReaders).super__Vector_base<BufferedReader_*,_std::allocator<BufferedReader_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_fileReaders).super__Vector_base<BufferedReader_*,_std::allocator<BufferedReader_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = 0x200000;
  if (blockSize != 0) {
    uVar2 = blockSize;
  }
  uVar3 = uVar2 + 0x8000;
  if (allocSize != 0) {
    uVar3 = allocSize;
  }
  this->m_blockSize = uVar2;
  this->m_allocSize = uVar3;
  uVar2 = uVar2 >> 1;
  if (prereadThreshold != 0) {
    uVar2 = prereadThreshold;
  }
  this->m_prereadThreshold = uVar2;
  if (readersCnt != 0) {
    uVar3 = 0;
    do {
      this_00 = (BufferedReader *)operator_new(0x1d8);
      BufferedFileReader::BufferedFileReader
                ((BufferedFileReader *)this_00,blockSize,allocSize,prereadThreshold);
      this_00->m_id = uVar3;
      __position._M_current =
           (this->m_fileReaders).
           super__Vector_base<BufferedReader_*,_std::allocator<BufferedReader_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_38 = this_00;
      if (__position._M_current ==
          (this->m_fileReaders).
          super__Vector_base<BufferedReader_*,_std::allocator<BufferedReader_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<BufferedReader*,std::allocator<BufferedReader*>>::
        _M_realloc_insert<BufferedReader*const&>
                  ((vector<BufferedReader*,std::allocator<BufferedReader*>> *)this,__position,
                   &local_38);
      }
      else {
        *__position._M_current = this_00;
        pppBVar1 = &(this->m_fileReaders).
                    super__Vector_base<BufferedReader_*,_std::allocator<BufferedReader_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppBVar1 = *pppBVar1 + 1;
      }
      uVar3 = uVar3 + 1;
    } while (readersCnt != uVar3);
  }
  this->m_readersCnt = readersCnt;
  return;
}

Assistant:

BufferedReaderManager::BufferedReaderManager(const uint32_t readersCnt, const uint32_t blockSize,
                                             const uint32_t allocSize, const uint32_t prereadThreshold)
{
    init(blockSize, allocSize, prereadThreshold);

    for (uint32_t i = 0; i < readersCnt; i++)
    {
        BufferedReader* reader = new BufferedFileReader(blockSize, allocSize, prereadThreshold);
        reader->setId(i);
        m_fileReaders.push_back(reader);
    }

    m_readersCnt = readersCnt;
}